

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::PopulateCustomVectors(cmCTestTestHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  bool bVar2;
  cmValue v;
  ostream *poVar3;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_PRE_TEST",(allocator<char> *)local_1b0);
  cmCTest::PopulateCustomVector(pcVar1,mf,(string *)&cmCTestLog_msg,&this->CustomPreTest);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_POST_TEST",(allocator<char> *)local_1b0);
  cmCTest::PopulateCustomVector(pcVar1,mf,(string *)&cmCTestLog_msg,&this->CustomPostTest);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_TESTS_IGNORE",(allocator<char> *)local_1b0);
  cmCTest::PopulateCustomVector(pcVar1,mf,(string *)&cmCTestLog_msg,&this->CustomTestsIgnore);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",
             (allocator<char> *)local_1b0);
  cmCTest::PopulateCustomInteger
            (pcVar1,mf,(string *)&cmCTestLog_msg,&this->CustomMaximumPassedTestOutputSize);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
             (allocator<char> *)local_1b0);
  cmCTest::PopulateCustomInteger
            (pcVar1,mf,(string *)&cmCTestLog_msg,&this->CustomMaximumFailedTestOutputSize);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION",
             (allocator<char> *)local_1b0);
  v = cmMakefile::GetDefinition(mf,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (v.Value != (string *)0x0) {
    bVar2 = SetTestOutputTruncation(this,v.Value);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "Invalid value for CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION: ");
      poVar3 = ::operator<<(poVar3,v);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x171,local_1b0[0],false);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_TEST",
                                    this->CustomPreTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_TEST",
                                    this->CustomPostTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_TESTS_IGNORE",
                                    this->CustomTestsIgnore);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",
    this->CustomMaximumPassedTestOutputSize);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
    this->CustomMaximumFailedTestOutputSize);

  cmValue dval = mf->GetDefinition("CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION");
  if (dval) {
    if (!this->SetTestOutputTruncation(dval)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Invalid value for CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION: "
                   << dval << std::endl);
    }
  }
}